

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keymacro.c
# Opt level: O0

wchar_t node__delete(EditLine *el,keymacro_node_t **inptr,wchar_t *str)

{
  wchar_t wVar1;
  keymacro_node_t *local_40;
  keymacro_node_t *xm;
  keymacro_node_t *prev_ptr;
  keymacro_node_t *ptr;
  wchar_t *str_local;
  keymacro_node_t **inptr_local;
  EditLine *el_local;
  
  xm = (keymacro_node_t *)0x0;
  local_40 = *inptr;
  prev_ptr = local_40;
  if (local_40->ch != *str) {
    while ((local_40->sibling != (keymacro_node_t *)0x0 && (local_40->sibling->ch != *str))) {
      local_40 = local_40->sibling;
    }
    if (local_40->sibling == (keymacro_node_t *)0x0) {
      return L'\0';
    }
    xm = local_40;
    prev_ptr = local_40->sibling;
  }
  if (str[1] == L'\0') {
    if (xm == (keymacro_node_t *)0x0) {
      *inptr = prev_ptr->sibling;
    }
    else {
      xm->sibling = prev_ptr->sibling;
    }
    prev_ptr->sibling = (keymacro_node_t *)0x0;
    node__put(el,prev_ptr);
    el_local._4_4_ = L'\x01';
  }
  else if ((prev_ptr->next == (keymacro_node_t *)0x0) ||
          (wVar1 = node__delete(el,&prev_ptr->next,str + 1), wVar1 != L'\x01')) {
    el_local._4_4_ = L'\0';
  }
  else if (prev_ptr->next == (keymacro_node_t *)0x0) {
    if (xm == (keymacro_node_t *)0x0) {
      *inptr = prev_ptr->sibling;
    }
    else {
      xm->sibling = prev_ptr->sibling;
    }
    prev_ptr->sibling = (keymacro_node_t *)0x0;
    node__put(el,prev_ptr);
    el_local._4_4_ = L'\x01';
  }
  else {
    el_local._4_4_ = L'\0';
  }
  return el_local._4_4_;
}

Assistant:

static int
node__delete(EditLine *el, keymacro_node_t **inptr, const wchar_t *str)
{
	keymacro_node_t *ptr;
	keymacro_node_t *prev_ptr = NULL;

	ptr = *inptr;

	if (ptr->ch != *str) {
		keymacro_node_t *xm;

		for (xm = ptr; xm->sibling != NULL; xm = xm->sibling)
			if (xm->sibling->ch == *str)
				break;
		if (xm->sibling == NULL)
			return 0;
		prev_ptr = xm;
		ptr = xm->sibling;
	}
	if (*++str == '\0') {
		/* we're there */
		if (prev_ptr == NULL)
			*inptr = ptr->sibling;
		else
			prev_ptr->sibling = ptr->sibling;
		ptr->sibling = NULL;
		node__put(el, ptr);
		return 1;
	} else if (ptr->next != NULL &&
	    node__delete(el, &ptr->next, str) == 1) {
		if (ptr->next != NULL)
			return 0;
		if (prev_ptr == NULL)
			*inptr = ptr->sibling;
		else
			prev_ptr->sibling = ptr->sibling;
		ptr->sibling = NULL;
		node__put(el, ptr);
		return 1;
	} else {
		return 0;
	}
}